

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-surface.c
# Opt level: O0

plutovg_surface_t * plutovg_surface_load_from_image_file(char *filename)

{
  stbi_uc *image_00;
  stbi_uc *image;
  int local_20;
  int channels;
  int height;
  int width;
  char *filename_local;
  
  _height = filename;
  image_00 = stbi_load(filename,&channels,&local_20,(int *)((long)&image + 4),4);
  if (image_00 == (stbi_uc *)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    filename_local = (char *)plutovg_surface_load_from_image(image_00,channels,local_20);
  }
  return (plutovg_surface_t *)filename_local;
}

Assistant:

plutovg_surface_t* plutovg_surface_load_from_image_file(const char* filename)
{
    int width, height, channels;
    stbi_uc* image = stbi_load(filename, &width, &height, &channels, STBI_rgb_alpha);
    if(image == NULL)
        return NULL;
    return plutovg_surface_load_from_image(image, width, height);
}